

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Endpoints.cpp
# Opt level: O0

bool soul::isParameterInput(EndpointDetails *details)

{
  bool bVar1;
  size_t sVar2;
  Type *this;
  Annotation *pAVar3;
  bool local_8b;
  bool local_74;
  allocator<char> local_71;
  string local_70;
  byte local_4d;
  byte local_3a;
  allocator<char> local_39;
  string local_38;
  EndpointDetails *local_18;
  EndpointDetails *details_local;
  
  local_18 = details;
  bVar1 = isEvent<soul::EndpointDetails>(details);
  if (bVar1) {
    bVar1 = isConsoleEndpoint(&local_18->name);
    if (bVar1) {
      details_local._7_1_ = false;
    }
    else {
      sVar2 = ArrayWithPreallocation<choc::value::Type,_2UL>::size(&local_18->dataTypes);
      if (sVar2 == 1) {
        this = ArrayWithPreallocation<choc::value::Type,_2UL>::front(&local_18->dataTypes);
        details_local._7_1_ = choc::value::Type::isPrimitive(this);
      }
      else {
        details_local._7_1_ = false;
      }
    }
  }
  else {
    bVar1 = isStream<soul::EndpointDetails>(local_18);
    local_3a = 0;
    local_4d = 0;
    local_74 = false;
    if (bVar1) {
      pAVar3 = &local_18->annotation;
      std::allocator<char>::allocator();
      local_3a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"name",&local_39);
      local_4d = 1;
      local_74 = Annotation::hasValue(pAVar3,&local_38);
    }
    if ((local_4d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_38);
    }
    if ((local_3a & 1) != 0) {
      std::allocator<char>::~allocator(&local_39);
    }
    if (local_74 == false) {
      bVar1 = isValue<soul::EndpointDetails>(local_18);
      local_8b = false;
      if (bVar1) {
        pAVar3 = &local_18->annotation;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"name",&local_71);
        local_8b = Annotation::hasValue(pAVar3,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator(&local_71);
      }
      if (local_8b == false) {
        details_local._7_1_ = false;
      }
      else {
        details_local._7_1_ = true;
      }
    }
    else {
      details_local._7_1_ = true;
    }
  }
  return details_local._7_1_;
}

Assistant:

bool isParameterInput (const EndpointDetails& details)
{
    if (isEvent (details))
    {
        if (isConsoleEndpoint (details.name))
            return false;

        if (details.dataTypes.size() != 1)
            return false;

        return details.dataTypes.front().isPrimitive();
    }

    if (isStream (details) && details.annotation.hasValue ("name"))
        return true;

    if (isValue (details) && details.annotation.hasValue ("name"))
        return true;

    return false;
}